

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlcdnumber.cpp
# Opt level: O2

void __thiscall QLCDNumber::setDigitCount(QLCDNumber *this,int numDigits)

{
  QString *this_00;
  QBitArray *this_01;
  uint uVar1;
  int iVar2;
  long lVar3;
  undefined8 uVar4;
  int *piVar5;
  undefined8 uVar6;
  QChar *pQVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  ulong i;
  long in_FS_OFFSET;
  char local_9c;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char> local_70;
  QArrayDataPointer<char16_t> local_58;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = *(long *)&(this->super_QFrame).super_QWidget.field_0x8;
  if (numDigits < 100) {
    if (numDigits < 0) {
      local_58.d._0_4_ = 2;
      local_58.size._4_4_ = 0;
      local_58.d._4_4_ = 0;
      local_58.ptr._0_4_ = 0;
      local_58.ptr._4_4_ = 0;
      local_58.size._0_4_ = 0;
      local_40 = "default";
      QObject::objectName();
      QString::toLocal8Bit((QByteArray *)&local_70,(QString *)&local_88);
      if (local_70.ptr == (char *)0x0) {
        local_70.ptr = (char *)&QByteArray::_empty;
      }
      QMessageLogger::warning
                ((char *)&local_58,"QLCDNumber::setNumDigits: (%s) Min 0 digits allowed",
                 local_70.ptr);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_70);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
      numDigits = 0;
    }
  }
  else {
    local_58.d._0_4_ = 2;
    local_58.size._4_4_ = 0;
    local_58.d._4_4_ = 0;
    local_58.ptr._0_4_ = 0;
    local_58.ptr._4_4_ = 0;
    local_58.size._0_4_ = 0;
    local_40 = "default";
    QObject::objectName();
    QString::toLocal8Bit((QByteArray *)&local_70,(QString *)&local_88);
    if (local_70.ptr == (char *)0x0) {
      local_70.ptr = (char *)&QByteArray::_empty;
    }
    QMessageLogger::warning
              ((char *)&local_58,"QLCDNumber::setNumDigits: (%s) Max 99 digits allowed",local_70.ptr
              );
    QArrayDataPointer<char>::~QArrayDataPointer(&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    numDigits = 99;
  }
  this_00 = (QString *)(lVar3 + 0x290);
  if (*(long *)(lVar3 + 0x298) == 0) {
    *(int *)(lVar3 + 0x278) = numDigits;
    QString::fill((QChar)(char16_t)this_00,0x20);
    QBitArray::fill((QBitArray *)(lVar3 + 0x2a8),false,(long)*(int *)(lVar3 + 0x278));
    iVar2 = *(int *)(lVar3 + 0x278);
    pQVar7 = QString::data(this_00);
    pQVar7[(long)iVar2 + -1].ucs = L'0';
  }
  else {
    uVar1 = *(uint *)(lVar3 + 0x278);
    uVar10 = numDigits - uVar1;
    if (uVar10 != 0) {
      if (uVar10 == 0 || numDigits < (int)uVar1) {
        QString::right((QString *)&local_58,this_00,(ulong)(uint)numDigits);
        uVar4 = *(undefined8 *)(lVar3 + 0x290);
        uVar6 = *(undefined8 *)(lVar3 + 0x298);
        *(ulong *)(lVar3 + 0x290) = CONCAT44(local_58.d._4_4_,local_58.d._0_4_);
        *(ulong *)(lVar3 + 0x298) = CONCAT44(local_58.ptr._4_4_,local_58.ptr._0_4_);
        local_58.d._0_4_ = (undefined4)uVar4;
        local_58.d._4_4_ = (undefined4)((ulong)uVar4 >> 0x20);
        local_58.ptr._0_4_ = (undefined4)uVar6;
        local_58.ptr._4_4_ = (undefined4)((ulong)uVar6 >> 0x20);
        uVar4 = *(undefined8 *)(lVar3 + 0x2a0);
        *(ulong *)(lVar3 + 0x2a0) = CONCAT44(local_58.size._4_4_,(undefined4)local_58.size);
        local_58.size._0_4_ = (undefined4)uVar4;
        local_58.size._4_4_ = (undefined4)((ulong)uVar4 >> 0x20);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
        piVar5 = *(int **)(lVar3 + 0x2a8);
        local_58.d._0_4_ = SUB84(piVar5,0);
        local_58.d._4_4_ = (undefined4)((ulong)piVar5 >> 0x20);
        local_58.ptr._0_4_ = (undefined4)*(undefined8 *)(lVar3 + 0x2b0);
        local_58.ptr._4_4_ = (undefined4)((ulong)*(undefined8 *)(lVar3 + 0x2b0) >> 0x20);
        local_58.size._0_4_ = (undefined4)*(undefined8 *)(lVar3 + 0x2b8);
        local_58.size._4_4_ = (undefined4)((ulong)*(undefined8 *)(lVar3 + 0x2b8) >> 0x20);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + 1;
          UNLOCK();
        }
        QBitArray::resize((longlong)(lVar3 + 0x2a8));
        local_9c = (char)numDigits;
        for (uVar9 = 0; (uint)numDigits != uVar9; uVar9 = uVar9 + 1) {
          QBitArray::setBit((QBitArray *)(lVar3 + 0x2a8),uVar9,
                            (*(byte *)(CONCAT44(local_58.ptr._4_4_,local_58.ptr._0_4_) + 1 +
                                      (long)((int)((int)uVar9 + (uVar1 - numDigits)) >> 3)) >>
                             ((int)uVar9 + (uint)(byte)((char)uVar1 - local_9c) & 7) & 1) != 0);
        }
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
      }
      else {
        local_58.d._0_4_ = 0;
        local_58.d._4_4_ = 0;
        local_58.ptr._0_4_ = 0;
        local_58.ptr._4_4_ = 0;
        local_58.size._0_4_ = 0;
        local_58.size._4_4_ = 0;
        QString::fill((QChar)(char16_t)&local_58,0x20);
        QString::insert(this_00,0,(QString *)&local_58);
        this_01 = (QBitArray *)(lVar3 + 0x2a8);
        uVar9 = (ulong)(uint)numDigits;
        QBitArray::resize((longlong)this_01);
        uVar8 = uVar1;
        while (uVar8 = uVar8 - 1, (long)(int)uVar10 < (long)uVar9) {
          uVar9 = uVar9 - 1;
          QBitArray::setBit(this_01,uVar9,
                            (*(byte *)(*(long *)(lVar3 + 0x2b0) + 1 + (long)((int)uVar8 >> 3)) >>
                             (uVar8 & 7) & 1) != 0);
        }
        i = 0;
        uVar9 = (ulong)uVar10;
        if ((int)uVar10 < 1) {
          uVar9 = i;
        }
        for (; uVar9 != i; i = i + 1) {
          QBitArray::clearBit(this_01,i);
        }
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      }
      *(int *)(lVar3 + 0x278) = numDigits;
      if (uVar1 == 0) {
        display(this,*(double *)(*(long *)&(this->super_QFrame).super_QWidget.field_0x8 + 0x280));
      }
      QWidget::update((QWidget *)this);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QLCDNumber::setDigitCount(int numDigits)
{
    Q_D(QLCDNumber);
    if (Q_UNLIKELY(numDigits > 99)) {
        qWarning("QLCDNumber::setNumDigits: (%s) Max 99 digits allowed",
                 objectName().toLocal8Bit().constData());
        numDigits = 99;
    }
    if (Q_UNLIKELY(numDigits < 0)) {
        qWarning("QLCDNumber::setNumDigits: (%s) Min 0 digits allowed",
                 objectName().toLocal8Bit().constData());
        numDigits = 0;
    }
    if (d->digitStr.isNull()) {                  // from constructor
        d->ndigits = numDigits;
        d->digitStr.fill(u' ', d->ndigits);
        d->points.fill(0, d->ndigits);
        d->digitStr[d->ndigits - 1] = u'0'; // "0" is the default number
    } else {
        bool doDisplay = d->ndigits == 0;
        if (numDigits == d->ndigits)             // no change
            return;
        int i;
        int dif;
        if (numDigits > d->ndigits) {            // expand
            dif = numDigits - d->ndigits;
            QString buf;
            buf.fill(u' ', dif);
            d->digitStr.insert(0, buf);
            d->points.resize(numDigits);
            for (i=numDigits-1; i>=dif; i--)
                d->points.setBit(i, d->points.testBit(i-dif));
            for (i=0; i<dif; i++)
                d->points.clearBit(i);
        } else {                                        // shrink
            dif = d->ndigits - numDigits;
            d->digitStr = d->digitStr.right(numDigits);
            QBitArray tmpPoints = d->points;
            d->points.resize(numDigits);
            for (i=0; i<numDigits; i++)
                d->points.setBit(i, tmpPoints.testBit(i+dif));
        }
        d->ndigits = numDigits;
        if (doDisplay)
            display(value());
        update();
    }
}